

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O1

bool ImGui::SFML::Init(Window *window,RenderTarget *target,bool loadDefaultFont)

{
  bool bVar1;
  uint uVar2;
  uint extraout_var;
  Vector2f local_18;
  
  uVar2 = (*target->_vptr_RenderTarget[2])(target);
  local_18.y = (float)extraout_var;
  local_18.x = (float)uVar2;
  bVar1 = Init(window,&local_18,loadDefaultFont);
  return bVar1;
}

Assistant:

bool Init(sf::Window& window, sf::RenderTarget& target, bool loadDefaultFont) {
    return Init(window, static_cast<sf::Vector2f>(target.getSize()), loadDefaultFont);
}